

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauGia.c
# Opt level: O2

int Dau_DsdBalance(Gia_Man_t *pGia,int *pFans,int nFans,int fAnd)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  Gia_Obj_t *pGVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar13 = (ulong)(uint)nFans;
  do {
    if (uVar13 == 1) {
      return *pFans;
    }
    if ((int)uVar13 < 2) {
      __assert_fail("nFans > 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauGia.c"
                    ,0xee,"int Dau_DsdBalance(Gia_Man_t *, int *, int, int)");
    }
    iVar1 = pFans[uVar13 - 1];
    iVar8 = pFans[uVar13 - 2 & 0xffffffff];
    if ((pGia->vHTable).nSize == 0) {
      if (fAnd == 0) {
        if (pGia->pMuxes == (uint *)0x0) {
          iVar4 = Abc_LitNot(iVar8);
          iVar1 = Gia_ManAppendMux2(pGia,iVar1,iVar4,iVar8);
        }
        else {
          uVar2 = Abc_LitIsCompl(iVar1);
          uVar3 = Abc_LitIsCompl(iVar8);
          iVar1 = Abc_LitRegular(iVar1);
          iVar8 = Abc_LitRegular(iVar8);
          pGVar9 = Gia_ManAppendObj(pGia);
          iVar4 = Abc_Lit2Var(iVar1);
          if (pGia->nObjs <= iVar4) {
            __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x2d5,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
          }
          iVar4 = Abc_Lit2Var(iVar8);
          if (pGia->nObjs <= iVar4) {
            __assert_fail("iLit1 >= 0 && Abc_Lit2Var(iLit1) < Gia_ManObjNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x2d6,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
          }
          iVar4 = Abc_Lit2Var(iVar1);
          iVar5 = Abc_Lit2Var(iVar8);
          if (iVar4 == iVar5) {
            __assert_fail("Abc_Lit2Var(iLit0) != Abc_Lit2Var(iLit1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                          ,0x2d7,"int Gia_ManAppendXorReal(Gia_Man_t *, int, int)");
          }
          uVar6 = Abc_Lit2Var(iVar1);
          uVar7 = Abc_Lit2Var(iVar8);
          iVar4 = Gia_ObjId(pGia,pGVar9);
          iVar5 = Abc_Lit2Var(iVar1);
          uVar10 = (ulong)(iVar4 - iVar5 & 0x1fffffff);
          if (uVar7 < uVar6) {
            *(ulong *)pGVar9 = *(ulong *)pGVar9 & 0xffffffffe0000000 | uVar10;
            iVar1 = Abc_LitIsCompl(iVar1);
            *(ulong *)pGVar9 = *(ulong *)pGVar9 & 0xffffffffdfffffff | (ulong)(uint)(iVar1 << 0x1d);
            iVar1 = Gia_ObjId(pGia,pGVar9);
            iVar4 = Abc_Lit2Var(iVar8);
            *(ulong *)pGVar9 =
                 *(ulong *)pGVar9 & 0xe0000000ffffffff | (ulong)(iVar1 - iVar4 & 0x1fffffff) << 0x20
            ;
            uVar6 = Abc_LitIsCompl(iVar8);
            uVar11 = (ulong)uVar6 << 0x3d;
            uVar10 = *(ulong *)pGVar9;
            uVar12 = 0xdfffffffffffffff;
          }
          else {
            *(ulong *)pGVar9 = *(ulong *)pGVar9 & 0xe0000000ffffffff | uVar10 << 0x20;
            uVar6 = Abc_LitIsCompl(iVar1);
            *(ulong *)pGVar9 = *(ulong *)pGVar9 & 0xdfffffffffffffff | (ulong)uVar6 << 0x3d;
            iVar1 = Gia_ObjId(pGia,pGVar9);
            iVar4 = Abc_Lit2Var(iVar8);
            *(ulong *)pGVar9 =
                 *(ulong *)pGVar9 & 0xffffffffe0000000 | (ulong)(iVar1 - iVar4 & 0x1fffffff);
            iVar1 = Abc_LitIsCompl(iVar8);
            uVar11 = (ulong)(uint)(iVar1 << 0x1d);
            uVar10 = *(ulong *)pGVar9;
            uVar12 = 0xffffffffdfffffff;
          }
          *(ulong *)pGVar9 = uVar10 & uVar12 | uVar11;
          pGia->nXors = pGia->nXors + 1;
          iVar1 = Gia_ObjId(pGia,pGVar9);
          iVar1 = Abc_LitNotCond(iVar1 * 2,uVar3 ^ uVar2);
        }
      }
      else {
        iVar1 = Gia_ManAppendAnd2(pGia,iVar1,iVar8);
      }
    }
    else if (fAnd == 0) {
      if (pGia->pMuxes == (uint *)0x0) {
        iVar1 = Gia_ManHashXor(pGia,iVar1,iVar8);
      }
      else {
        iVar1 = Gia_ManHashXorReal(pGia,iVar1,iVar8);
      }
    }
    else {
      iVar1 = Gia_ManHashAnd(pGia,iVar1,iVar8);
    }
    iVar8 = Abc_Lit2Var(iVar1);
    pGVar9 = Gia_ManObj(pGia,iVar8);
    uVar10 = *(ulong *)pGVar9;
    uVar11 = uVar10 & 0x1fffffff;
    if (uVar11 != 0x1fffffff && -1 < (int)uVar10) {
      if (fAnd == 0) {
        if (pGia->pMuxes != (uint *)0x0) {
          Gia_ObjSetXorLevel(pGia,pGVar9);
          goto LAB_00437da3;
        }
        if ((~*(uint *)(pGVar9 + -uVar11) & 0x1fffffff) != 0 &&
            -1 < (int)*(uint *)(pGVar9 + -uVar11)) {
          Gia_ObjSetAndLevel(pGia,pGVar9 + -uVar11);
          uVar10 = *(ulong *)pGVar9;
        }
        uVar10 = (ulong)((uint)(uVar10 >> 0x20) & 0x1fffffff);
        if ((~*(uint *)(pGVar9 + -uVar10) & 0x1fffffff) != 0 &&
            -1 < (int)*(uint *)(pGVar9 + -uVar10)) {
          Gia_ObjSetAndLevel(pGia,pGVar9 + -uVar10);
        }
      }
      Gia_ObjSetAndLevel(pGia,pGVar9);
    }
LAB_00437da3:
    Dau_DsdAddToArray(pGia,pFans,(int)(uVar13 - 2),iVar1);
    uVar13 = uVar13 - 1;
  } while( true );
}

Assistant:

int Dau_DsdBalance( Gia_Man_t * pGia, int * pFans, int nFans, int fAnd )
{
    Gia_Obj_t * pObj;
    int iFan0, iFan1, iFan;
    if ( nFans == 1 )
        return pFans[0];
    assert( nFans > 1 );
    iFan0 = pFans[--nFans];
    iFan1 = pFans[--nFans];
    if ( Vec_IntSize(&pGia->vHTable) == 0 )
    {
        if ( fAnd )
            iFan = Gia_ManAppendAnd2( pGia, iFan0, iFan1 );
        else if ( pGia->pMuxes )
        {
            int fCompl = Abc_LitIsCompl(iFan0) ^ Abc_LitIsCompl(iFan1);
            iFan = Gia_ManAppendXorReal( pGia, Abc_LitRegular(iFan0), Abc_LitRegular(iFan1) );
            iFan = Abc_LitNotCond( iFan, fCompl );
        }
        else 
            iFan = Gia_ManAppendXor2( pGia, iFan0, iFan1 );
    }
    else
    {
        if ( fAnd )
            iFan = Gia_ManHashAnd( pGia, iFan0, iFan1 );
        else if ( pGia->pMuxes )
            iFan = Gia_ManHashXorReal( pGia, iFan0, iFan1 );
        else 
            iFan = Gia_ManHashXor( pGia, iFan0, iFan1 );
    }
    pObj = Gia_ManObj(pGia, Abc_Lit2Var(iFan));
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( fAnd )
            Gia_ObjSetAndLevel( pGia, pObj );
        else if ( pGia->pMuxes )
            Gia_ObjSetXorLevel( pGia, pObj );
        else 
        {
            if ( Gia_ObjIsAnd(Gia_ObjFanin0(pObj)) )
                Gia_ObjSetAndLevel( pGia, Gia_ObjFanin0(pObj) );
            if ( Gia_ObjIsAnd(Gia_ObjFanin1(pObj)) )
                Gia_ObjSetAndLevel( pGia, Gia_ObjFanin1(pObj) );
            Gia_ObjSetAndLevel( pGia, pObj );
        }
    }
    Dau_DsdAddToArray( pGia, pFans, nFans++, iFan );
    return Dau_DsdBalance( pGia, pFans, nFans, fAnd );
}